

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can_implicitly_cast.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BindCanCastImplicitlyExpression(duckdb *this,FunctionBindExpressionInput *input)

{
  bool value;
  reference pvVar1;
  pointer pEVar2;
  pointer pEVar3;
  undefined8 local_60;
  Value local_58;
  
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(input->children,0);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(input->children,1);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar1);
  if (((byte)((pEVar2->return_type).id_ - SQLNULL) < 2) ||
     ((byte)((pEVar3->return_type).id_ - SQLNULL) < 2)) {
    *(undefined8 *)this = 0;
  }
  else {
    value = CanCastImplicitly(input->context,&pEVar2->return_type,&pEVar3->return_type);
    Value::BOOLEAN(&local_58,value);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_60,&local_58);
    *(undefined8 *)this = local_60;
    local_60 = 0;
    Value::~Value(&local_58);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BindCanCastImplicitlyExpression(FunctionBindExpressionInput &input) {
	auto &source_type = input.children[0]->return_type;
	auto &target_type = input.children[1]->return_type;
	if (source_type.id() == LogicalTypeId::UNKNOWN || source_type.id() == LogicalTypeId::SQLNULL ||
	    target_type.id() == LogicalTypeId::UNKNOWN || target_type.id() == LogicalTypeId::SQLNULL) {
		// parameter - unknown return type
		return nullptr;
	}
	// emit a constant expression
	return make_uniq<BoundConstantExpression>(
	    Value::BOOLEAN(CanCastImplicitly(input.context, source_type, target_type)));
}